

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

char * __thiscall MeCab::whatlog::str(whatlog *this)

{
  string local_30 [32];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->str_,local_30);
  std::__cxx11::string::~string(local_30);
  return (this->str_)._M_dataplus._M_p;
}

Assistant:

const char *str() {
    str_ = stream_.str();
    return str_.c_str();
  }